

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_module(lysp_yin_ctx **yin_ctx,ly_in *in,lys_module *mod)

{
  LY_ERR LVar1;
  ly_stmt stmt;
  lysp_yin_ctx *plVar2;
  char *pcVar3;
  ushort **ppuVar4;
  size_t sVar5;
  char *pcVar6;
  ly_ctx *local_78;
  ly_ctx *local_68;
  undefined1 auStack_58 [4];
  LY_ERR ret__;
  lysf_ctx fctx;
  lysp_module *mod_p;
  ly_stmt kw;
  LY_ERR ret;
  lys_module *mod_local;
  ly_in *in_local;
  lysp_yin_ctx **yin_ctx_local;
  
  mod_p._4_4_ = LY_SUCCESS;
  fctx.ext_set.field_2.dnodes = (lyd_node **)0x0;
  memset(auStack_58,0,0x20);
  _auStack_58 = mod->ctx;
  plVar2 = (lysp_yin_ctx *)calloc(1,0x50);
  *yin_ctx = plVar2;
  if (*yin_ctx == (lysp_yin_ctx *)0x0) {
    ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_module");
    yin_ctx_local._4_4_ = LY_EMEM;
  }
  else {
    (*yin_ctx)->format = LYS_IN_YIN;
    LVar1 = ly_set_new(&(*yin_ctx)->parsed_mods);
    if (LVar1 == LY_SUCCESS) {
      yin_ctx_local._4_4_ = lyxml_ctx_new(mod->ctx,in,&(*yin_ctx)->xmlctx);
      if (yin_ctx_local._4_4_ == LY_SUCCESS) {
        (*yin_ctx)->main_ctx = (lysp_ctx *)*yin_ctx;
        fctx.ext_set.field_2.dnodes = (lyd_node **)calloc(1,0x80);
        if (fctx.ext_set.field_2.dnodes == (lyd_node **)0x0) {
          ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_module");
        }
        else {
          *fctx.ext_set.field_2.dnodes = (lyd_node *)mod;
          ly_set_add((*yin_ctx)->parsed_mods,fctx.ext_set.field_2.dnodes,'\x01',(uint32_t *)0x0);
          stmt = yin_match_keyword(*yin_ctx,((*yin_ctx)->xmlctx->field_5).name,
                                   ((*yin_ctx)->xmlctx->field_6).name_len,
                                   ((*yin_ctx)->xmlctx->field_3).prefix,
                                   ((*yin_ctx)->xmlctx->field_4).prefix_len,LY_STMT_NONE);
          if (stmt == LY_STMT_SUBMODULE) {
            ly_log(mod->ctx,LY_LLERR,LY_EDENIED,
                   "Input data contains submodule which cannot be parsed directly without its main module."
                  );
            mod_p._4_4_ = LY_EINVAL;
          }
          else if (stmt == LY_STMT_MODULE) {
            mod_p._4_4_ = yin_parse_mod(*yin_ctx,(lysp_module *)fctx.ext_set.field_2.dnodes);
            if (mod_p._4_4_ == LY_SUCCESS) {
              while (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)*in->current] & 0x2000) != 0) {
                if (*in->current == '\n') {
                  in->line = in->line + 1;
                }
                ly_in_skip(in,1);
              }
              if (*in->current == '\0') {
                mod->parsed = (lysp_module *)fctx.ext_set.field_2;
              }
              else {
                if (*yin_ctx == (lysp_yin_ctx *)0x0) {
                  local_78 = (ly_ctx *)0x0;
                }
                else {
                  local_78 = (ly_ctx *)
                             **(undefined8 **)
                               ((*yin_ctx)->parsed_mods->field_2).dnodes
                               [(*yin_ctx)->parsed_mods->count - 1];
                }
                pcVar3 = in->current;
                sVar5 = strlen(in->current);
                pcVar6 = "";
                if (0xf < sVar5) {
                  pcVar6 = "...";
                }
                ly_vlog(local_78,(char *)0x0,LYVE_SYNTAX,
                        "Trailing garbage \"%.*s%s\" after module, expected end-of-input.",0xf,
                        pcVar3,pcVar6);
                mod_p._4_4_ = LY_EVALID;
              }
            }
          }
          else {
            if (*yin_ctx == (lysp_yin_ctx *)0x0) {
              local_68 = (ly_ctx *)0x0;
            }
            else {
              local_68 = (ly_ctx *)
                         **(undefined8 **)
                           ((*yin_ctx)->parsed_mods->field_2).dnodes
                           [(*yin_ctx)->parsed_mods->count - 1];
            }
            pcVar3 = lyplg_ext_stmt2str(stmt);
            ly_vlog(local_68,(char *)0x0,LYVE_SYNTAX,
                    "Invalid keyword \"%s\", expected \"module\" or \"submodule\".",pcVar3);
            mod_p._4_4_ = LY_EVALID;
          }
        }
        ly_log_location_revert(0,0,0,1);
        if (mod_p._4_4_ != LY_SUCCESS) {
          lysp_module_free((lysf_ctx *)auStack_58,(lysp_module *)fctx.ext_set.field_2.dnodes);
          lysp_yin_ctx_free(*yin_ctx);
          *yin_ctx = (lysp_yin_ctx *)0x0;
        }
        yin_ctx_local._4_4_ = mod_p._4_4_;
      }
    }
    else {
      free(*yin_ctx);
      ly_log(mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_module");
      yin_ctx_local._4_4_ = LY_EMEM;
    }
  }
  return yin_ctx_local._4_4_;
}

Assistant:

LY_ERR
yin_parse_module(struct lysp_yin_ctx **yin_ctx, struct ly_in *in, struct lys_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    enum ly_stmt kw = LY_STMT_NONE;
    struct lysp_module *mod_p = NULL;
    struct lysf_ctx fctx = {.ctx = mod->ctx};

    /* create context */
    *yin_ctx = calloc(1, sizeof **yin_ctx);
    LY_CHECK_ERR_RET(!(*yin_ctx), LOGMEM(mod->ctx), LY_EMEM);
    (*yin_ctx)->format = LYS_IN_YIN;
    LY_CHECK_ERR_RET(ly_set_new(&(*yin_ctx)->parsed_mods), free(*yin_ctx); LOGMEM(mod->ctx), LY_EMEM);
    LY_CHECK_RET(lyxml_ctx_new(mod->ctx, in, &(*yin_ctx)->xmlctx));
    (*yin_ctx)->main_ctx = (struct lysp_ctx *)(*yin_ctx);

    mod_p = calloc(1, sizeof *mod_p);
    LY_CHECK_ERR_GOTO(!mod_p, LOGMEM(mod->ctx), cleanup);
    mod_p->mod = mod;
    ly_set_add((*yin_ctx)->parsed_mods, mod_p, 1, NULL);

    /* check module */
    kw = yin_match_keyword(*yin_ctx, (*yin_ctx)->xmlctx->name, (*yin_ctx)->xmlctx->name_len, (*yin_ctx)->xmlctx->prefix,
            (*yin_ctx)->xmlctx->prefix_len, LY_STMT_NONE);
    if (kw == LY_STMT_SUBMODULE) {
        LOGERR(mod->ctx, LY_EDENIED, "Input data contains submodule which cannot be parsed directly without its main module.");
        ret = LY_EINVAL;
        goto cleanup;
    } else if (kw != LY_STMT_MODULE) {
        LOGVAL_PARSER((struct lysp_ctx *)*yin_ctx, LY_VCODE_MOD_SUBOMD, lyplg_ext_stmt2str(kw));
        ret = LY_EVALID;
        goto cleanup;
    }

    /* parse module substatements */
    ret = yin_parse_mod(*yin_ctx, mod_p);
    LY_CHECK_GOTO(ret, cleanup);

    /* skip possible trailing whitespaces at end of the input */
    while (isspace(in->current[0])) {
        if (in->current[0] == '\n') {
            LY_IN_NEW_LINE(in);
        }
        ly_in_skip(in, 1);
    }
    if (in->current[0]) {
        LOGVAL_PARSER((struct lysp_ctx *)*yin_ctx, LY_VCODE_TRAILING_MOD, 15, in->current,
                strlen(in->current) > 15 ? "..." : "");
        ret = LY_EVALID;
        goto cleanup;
    }

    mod->parsed = mod_p;

cleanup:
    ly_log_location_revert(0, 0, 0, 1);
    if (ret) {
        lysp_module_free(&fctx, mod_p);
        lysp_yin_ctx_free(*yin_ctx);
        *yin_ctx = NULL;
    }
    return ret;
}